

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

void __thiscall WorkQueue<CMU462::WorkItem>::clear(WorkQueue<CMU462::WorkItem> *this)

{
  WorkQueue<CMU462::WorkItem> *this_local;
  
  std::mutex::lock(&this->lock);
  std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::clear(&this->storage);
  std::mutex::unlock(&this->lock);
  return;
}

Assistant:

void clear() {
      lock.lock();
      storage.clear();
      lock.unlock();
    }